

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder.c
# Opt level: O0

_Bool encode_init(lzma_coder_conflict9 *coder,lzma_mf *mf)

{
  uint32_t uVar1;
  lzma_mf *mf_local;
  lzma_coder_conflict9 *coder_local;
  
  uVar1 = mf_position(mf);
  if (uVar1 != 0) {
    __assert_fail("mf_position(mf) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder.c"
                  ,0x117,"_Bool encode_init(lzma_coder *, lzma_mf *)");
  }
  if (mf->read_pos == mf->read_limit) {
    if (mf->action == LZMA_RUN) {
      return false;
    }
    if (mf->write_pos != mf->read_pos) {
      __assert_fail("mf->write_pos == mf->read_pos",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder.c"
                    ,0x11e,"_Bool encode_init(lzma_coder *, lzma_mf *)");
    }
    if (mf->action != LZMA_FINISH) {
      __assert_fail("mf->action == LZMA_FINISH",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder.c"
                    ,0x11f,"_Bool encode_init(lzma_coder *, lzma_mf *)");
    }
  }
  else {
    mf_skip(mf,1);
    mf->read_ahead = 0;
    rc_bit(&coder->rc,coder->is_match[0],0);
    rc_bittree(&coder->rc,coder->literal[0],8,(uint)*mf->buffer);
  }
  coder->is_initialized = true;
  return true;
}

Assistant:

static bool
encode_init(lzma_coder *coder, lzma_mf *mf)
{
	assert(mf_position(mf) == 0);

	if (mf->read_pos == mf->read_limit) {
		if (mf->action == LZMA_RUN)
			return false; // We cannot do anything.

		// We are finishing (we cannot get here when flushing).
		assert(mf->write_pos == mf->read_pos);
		assert(mf->action == LZMA_FINISH);
	} else {
		// Do the actual initialization. The first LZMA symbol must
		// always be a literal.
		mf_skip(mf, 1);
		mf->read_ahead = 0;
		rc_bit(&coder->rc, &coder->is_match[0][0], 0);
		rc_bittree(&coder->rc, coder->literal[0], 8, mf->buffer[0]);
	}

	// Initialization is done (except if empty file).
	coder->is_initialized = true;

	return true;
}